

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test7(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  reference piVar2;
  int *piVar3;
  bool local_1ea;
  int *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_178 [14];
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  vector<int,_std::allocator<int>_> v2;
  int local_110 [36];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> v1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  memcpy(local_110,&DAT_00108180,0x90);
  local_78 = 0x24;
  this = (allocator<int> *)
         ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 7);
  local_80 = local_110;
  std::allocator<int>::allocator(this);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l_00,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_178[8] = 6;
  local_178[9] = 1;
  local_178[10] = 1;
  local_178[0xb] = 1;
  local_178[4] = 4;
  local_178[5] = 2;
  local_178[6] = -3;
  local_178[7] = 9;
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 1;
  local_178[3] = 5;
  local_140 = local_178;
  local_138 = 0xc;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  __l._M_len = local_138;
  __l._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_130,__l,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_70);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_70);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&x), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    CP::queue<int>::push((queue<int> *)&b.mFront,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_130);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_130);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &x_1), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    CP::queue<int>::push((queue<int> *)local_48,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  while (piVar3 = CP::queue<int>::front((queue<int> *)&b.mFront), *piVar3 == 0) {
    CP::queue<int>::pop((queue<int> *)&b.mFront);
  }
  while (piVar3 = CP::queue<int>::front((queue<int> *)local_48), *piVar3 == 0) {
    CP::queue<int>::pop((queue<int> *)local_48);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_1ea = false;
  if (!bVar1) {
    local_1ea = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
    local_1ea = !local_1ea;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_130);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_1ea;
}

Assistant:

bool test7() {
  CP::queue<int> a,b;
  std::vector<int> v1 = {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1,5,4,2,-3,9,6,999,999,999};
  std::vector<int> v2 = {0,0,1,5,4,2,-3,9,6,1,1,1};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  while (a.front() == 0) a.pop();
  while (b.front() == 0) b.pop();
  return ( ((a == b) == false)  && ((b == a) == false));
}